

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O0

bool __thiscall Finder::check(Finder *this)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  element_type *peVar4;
  qpdf_offset_t qVar5;
  unsigned_long local_148;
  Token local_140 [111];
  byte local_d1;
  long lStack_d0;
  bool result;
  qpdf_offset_t offset;
  allocator<char> local_b1;
  string local_b0 [32];
  shared_ptr<InputSource> local_90;
  Token local_80 [8];
  Token t;
  QPDFTokenizer local_18 [8];
  QPDFTokenizer tokenizer;
  Finder *this_local;
  
  _tokenizer = this;
  QPDFTokenizer::QPDFTokenizer(local_18);
  std::shared_ptr<InputSource>::shared_ptr(&local_90,&this->is);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"finder",&local_b1);
  QPDFTokenizer::readToken(local_80,local_18,&local_90,local_b0,1,0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::shared_ptr<InputSource>::~shared_ptr(&local_90);
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->is);
  lStack_d0 = (**(code **)(*(long *)peVar4 + 0x20))();
  QPDFTokenizer::Token::Token(local_140,tt_word,(string *)&this->str);
  bVar3 = QPDFTokenizer::Token::operator==(local_80,local_140);
  QPDFTokenizer::Token::~Token(local_140);
  local_d1 = bVar3;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->is);
  lVar2 = lStack_d0;
  local_148 = std::__cxx11::string::length();
  qVar5 = QIntC::to_offset<unsigned_long>(&local_148);
  (**(code **)(*(long *)peVar4 + 0x28))(peVar4,lVar2 - qVar5,0);
  bVar1 = local_d1;
  QPDFTokenizer::Token::~Token(local_80);
  QPDFTokenizer::~QPDFTokenizer(local_18);
  return (bool)(bVar1 & 1);
}

Assistant:

bool
Finder::check()
{
    QPDFTokenizer tokenizer;
    QPDFTokenizer::Token t = tokenizer.readToken(is, "finder", true);
    qpdf_offset_t offset = this->is->tell();
    bool result = (t == QPDFTokenizer::Token(QPDFTokenizer::tt_word, str));
    this->is->seek(offset - QIntC::to_offset(this->str.length()), SEEK_SET);
    return result;
}